

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

void duckdb::DisabledFilesystemsSetting::ResetGlobal(DatabaseInstance *db,DBConfig *config)

{
  FileSystem *pFVar1;
  InternalException *this;
  string local_48;
  
  if (db != (DatabaseInstance *)0x0) {
    pFVar1 = FileSystem::GetFileSystem(db);
    local_48._M_dataplus._M_p = (pointer)0x0;
    local_48._M_string_length = 0;
    local_48.field_2._M_allocated_capacity = 0;
    (*pFVar1->_vptr_FileSystem[0x28])(pFVar1);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"disabled_filesystems can only be set in an active database","");
  InternalException::InternalException(this,&local_48);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DisabledFilesystemsSetting::ResetGlobal(DatabaseInstance *db, DBConfig &config) {
	if (!db) {
		throw InternalException("disabled_filesystems can only be set in an active database");
	}
	auto &fs = FileSystem::GetFileSystem(*db);
	fs.SetDisabledFileSystems(vector<string>());
}